

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int setContext(XML_Parser parser,XML_Char *context)

{
  STRING_POOL *pool;
  char cVar1;
  undefined1 *puVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  NAMED *pNVar6;
  PREFIX *prefix;
  XML_Char *pXVar7;
  char *pcVar8;
  XML_Char *s;
  
  if (*context != '\0') {
    pool = (STRING_POOL *)((long)parser + 0x418);
    pcVar8 = context;
    do {
      cVar1 = *context;
      if (cVar1 == '\0') {
LAB_004c66d8:
        if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
           (iVar5 = poolGrow(pool), iVar5 == 0)) {
          bVar4 = false;
        }
        else {
          puVar2 = *(undefined1 **)((long)parser + 0x430);
          *(undefined1 **)((long)parser + 0x430) = puVar2 + 1;
          *puVar2 = 0;
          pNVar6 = lookup((HASH_TABLE *)((long)parser + 0x290),*(KEY *)((long)parser + 0x438),0);
          if (pNVar6 != (NAMED *)0x0) {
            *(undefined1 *)&pNVar6[7].name = 1;
          }
          context = context + (*context != '\0');
          *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
          bVar4 = true;
          pcVar8 = context;
        }
joined_r0x004c68ea:
        if (!bVar4) {
          return 0;
        }
      }
      else {
        if (cVar1 == '=') {
          pcVar3 = context;
          prefix = (PREFIX *)((long)parser + 0x390);
          if (*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x438)) {
LAB_004c67ed:
            while( true ) {
              pcVar8 = pcVar3 + 1;
              if ((*pcVar8 == '\0') || (*pcVar8 == '\f')) break;
              if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
                 (iVar5 = poolGrow(pool), iVar5 == 0)) goto LAB_004c68e4;
              cVar1 = *pcVar8;
              pcVar3 = *(char **)((long)parser + 0x430);
              *(char **)((long)parser + 0x430) = pcVar3 + 1;
              *pcVar3 = cVar1;
              pcVar3 = pcVar8;
            }
            if ((*(long *)((long)parser + 0x430) != *(long *)((long)parser + 0x428)) ||
               (iVar5 = poolGrow(pool), iVar5 != 0)) {
              puVar2 = *(undefined1 **)((long)parser + 0x430);
              *(undefined1 **)((long)parser + 0x430) = puVar2 + 1;
              *puVar2 = 0;
              bVar4 = false;
              iVar5 = addBinding(parser,prefix,(ATTRIBUTE_ID *)0x0,
                                 *(XML_Char **)((long)parser + 0x438),
                                 (BINDING **)((long)parser + 0x3e0));
              if (iVar5 != 0) {
                *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
                context = pcVar8;
                if (*pcVar8 != '\0') {
                  context = pcVar3 + 2;
                }
                bVar4 = true;
                pcVar8 = context;
              }
              goto joined_r0x004c68ea;
            }
          }
          else if ((*(long *)((long)parser + 0x430) != *(long *)((long)parser + 0x428)) ||
                  (iVar5 = poolGrow(pool), iVar5 != 0)) {
            puVar2 = *(undefined1 **)((long)parser + 0x430);
            *(undefined1 **)((long)parser + 0x430) = puVar2 + 1;
            *puVar2 = 0;
            prefix = (PREFIX *)
                     lookup((HASH_TABLE *)((long)parser + 0x308),*(KEY *)((long)parser + 0x438),0x10
                           );
            if (prefix != (PREFIX *)0x0) {
              if (prefix->name == *(XML_Char **)((long)parser + 0x438)) {
                pXVar7 = poolCopyString((STRING_POOL *)((long)parser + 0x330),prefix->name);
                prefix->name = pXVar7;
                if (pXVar7 == (XML_Char *)0x0) goto LAB_004c68e4;
              }
              *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
              goto LAB_004c67ed;
            }
          }
LAB_004c68e4:
          bVar4 = false;
          goto joined_r0x004c68ea;
        }
        if (cVar1 == '\f') goto LAB_004c66d8;
        if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
           (iVar5 = poolGrow(pool), iVar5 == 0)) {
          return 0;
        }
        cVar1 = *context;
        pcVar3 = *(char **)((long)parser + 0x430);
        *(char **)((long)parser + 0x430) = pcVar3 + 1;
        *pcVar3 = cVar1;
        context = context + 1;
      }
    } while (*pcVar8 != '\0');
  }
  return 1;
}

Assistant:

static
int setContext(XML_Parser parser, const XML_Char *context)
{
  const XML_Char *s = context;

  while (*context != XML_T('\0')) {
    if (*s == CONTEXT_SEP || *s == XML_T('\0')) {
      ENTITY *e;
      if (!poolAppendChar(&tempPool, XML_T('\0')))
        return 0;
      e = (ENTITY *)lookup(&dtd.generalEntities, poolStart(&tempPool), 0);
      if (e)
        e->open = 1;
      if (*s != XML_T('\0'))
        s++;
      context = s;
      poolDiscard(&tempPool);
    }
    else if (*s == '=') {
      PREFIX *prefix;
      if (poolLength(&tempPool) == 0)
        prefix = &dtd.defaultPrefix;
      else {
        if (!poolAppendChar(&tempPool, XML_T('\0')))
          return 0;
        prefix = (PREFIX *)lookup(&dtd.prefixes, poolStart(&tempPool), sizeof(PREFIX));
        if (!prefix)
          return 0;
        if (prefix->name == poolStart(&tempPool)) {
          prefix->name = poolCopyString(&dtd.pool, prefix->name);
          if (!prefix->name)
            return 0;
        }
        poolDiscard(&tempPool);
      }
      for (context = s + 1; *context != CONTEXT_SEP && *context != XML_T('\0'); context++)
        if (!poolAppendChar(&tempPool, *context))
          return 0;
      if (!poolAppendChar(&tempPool, XML_T('\0')))
        return 0;
      if (!addBinding(parser, prefix, 0, poolStart(&tempPool), &inheritedBindings))
        return 0;
      poolDiscard(&tempPool);
      if (*context != XML_T('\0'))
        ++context;
      s = context;
    }
    else {
      if (!poolAppendChar(&tempPool, *s))
        return 0;
      s++;
    }
  }
  return 1;
}